

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixedElastic.hpp
# Opt level: O1

void __thiscall njoy::ENDFtk::section::Type<7,_2>::MixedElastic::~MixedElastic(MixedElastic *this)

{
  pointer pdVar1;
  pointer plVar2;
  
  pdVar1 = (this->incoherent_).super_TabulationRecord.yValues.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->incoherent_).super_TabulationRecord.yValues.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  pdVar1 = (this->incoherent_).super_TabulationRecord.xValues.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->incoherent_).super_TabulationRecord.xValues.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  plVar2 = (this->incoherent_).super_TabulationRecord.super_InterpolationBase.
           interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (plVar2 != (pointer)0x0) {
    operator_delete(plVar2,(long)*(pointer *)
                                  ((long)&(this->incoherent_).super_TabulationRecord.
                                          super_InterpolationBase.interpolationSchemeIndices.
                                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                          super__Vector_impl_data + 0x10) - (long)plVar2);
  }
  plVar2 = (this->incoherent_).super_TabulationRecord.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  if (plVar2 != (pointer)0x0) {
    operator_delete(plVar2,(long)*(pointer *)
                                  ((long)&(this->incoherent_).super_TabulationRecord.
                                          super_InterpolationBase.boundaryIndices.
                                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                          super__Vector_impl_data + 0x10) - (long)plVar2);
  }
  std::vector<njoy::ENDFtk::ListRecord,_std::allocator<njoy::ENDFtk::ListRecord>_>::~vector
            (&(this->coherent_).temperatures_);
  pdVar1 = (this->coherent_).principal_.yValues.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->coherent_).principal_.yValues.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  pdVar1 = (this->coherent_).principal_.xValues.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->coherent_).principal_.xValues.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  plVar2 = (this->coherent_).principal_.super_InterpolationBase.interpolationSchemeIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  if (plVar2 != (pointer)0x0) {
    operator_delete(plVar2,(long)*(pointer *)
                                  ((long)&(this->coherent_).principal_.super_InterpolationBase.
                                          interpolationSchemeIndices.
                                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                          super__Vector_impl_data + 0x10) - (long)plVar2);
  }
  plVar2 = (this->coherent_).principal_.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  if (plVar2 != (pointer)0x0) {
    operator_delete(plVar2,(long)*(pointer *)
                                  ((long)&(this->coherent_).principal_.super_InterpolationBase.
                                          boundaryIndices.
                                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                          super__Vector_impl_data + 0x10) - (long)plVar2);
    return;
  }
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT MixedElastic {

  /* fields */
  CoherentElastic coherent_;
  IncoherentElastic incoherent_;

public:

  /* constructor */
  #include "ENDFtk/section/7/2/MixedElastic/src/ctor.hpp"

  /**
   *  @brief Return the LTHR flag for mixed elastic scattering
   */
  static constexpr int LTHR() { return 3; }

  /**
   *  @brief Return the LTHR flag for mixed elastic scattering
   */
  int elasticScatteringType() const { return this->LTHR(); }

  /**
   *  @brief Return the coherent elastic scattering data
   */
  const CoherentElastic& coherent() const { return this->coherent_; }

  /**
   *  @brief Return the incoherent elastic scattering data
   */
  const IncoherentElastic& incoherent() const { return this->incoherent_; }

  #include "ENDFtk/section/7/2/MixedElastic/src/NC.hpp"
  #include "ENDFtk/section/7/2/MixedElastic/src/print.hpp"
}